

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O0

bool __thiscall DReachabilityPropagator::propagateNewEdge(DReachabilityPropagator *this,int edge)

{
  undefined1 uVar1;
  bool bVar2;
  undefined4 in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar3;
  int *added_node;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  bool ok;
  vector<int,_std::allocator<int>_> added_nodes;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  value_type_conflict *__x;
  undefined7 in_stack_ffffffffffffff80;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  value_type_conflict *local_50;
  undefined4 local_48;
  undefined1 local_31;
  value_type_conflict local_30 [6];
  undefined4 in_stack_ffffffffffffffe8;
  vector<int,_std::allocator<int>_> *pvVar4;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar5;
  
  __x = local_30;
  pvVar4 = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2af4c2);
  uVar1 = GraphPropagator::coherence_innodes
                    ((GraphPropagator *)
                     CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                     (int)((ulong)pvVar4 >> 0x20),
                     (vector<int,_std::allocator<int>_> *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8)
                    );
  local_31 = uVar1;
  if ((bool)uVar1) {
    local_50 = local_30;
    local_58._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      if (!bVar2) break;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                (&local_58);
      Tint::operator=((Tint *)CONCAT17(uVar1,in_stack_ffffffffffffff80),(int)((ulong)__x >> 0x20));
      add_innode((DReachabilityPropagator *)
                 CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff5c);
      pVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)
                         CONCAT17(uVar1,in_stack_ffffffffffffff80),__x);
      in_stack_ffffffffffffff67 = pVar3.second;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_58);
    }
    bVar5 = 1;
  }
  else {
    bVar5 = 0;
  }
  local_48 = 1;
  std::vector<int,_std::allocator<int>_>::~vector(in_RDI);
  return (bool)(bVar5 & 1);
}

Assistant:

bool DReachabilityPropagator::propagateNewEdge(int edge) {
	assert(getEdgeVar(edge).isFixed());
	assert(getEdgeVar(edge).isTrue());
	std::vector<int> added_nodes;
	const bool ok = GraphPropagator::coherence_innodes(edge, added_nodes);
	if (!ok) {
		return false;
	}
	for (const int& added_node : added_nodes) {
		if (DEBUG) {
			std::cout << "Adding in " << __FILE__ << __LINE__ << '\n';
		}
		last_state_n[added_node] = VT_IN;
		add_innode(added_node);
		new_node.insert(added_node);
	}
	return true;
}